

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O2

void ngx_slab_free_locked(ngx_slab_pool_t *pool,void *p)

{
  ngx_slab_page_t *page;
  ulong *puVar1;
  ngx_uint_t *pnVar2;
  ngx_slab_page_t *pnVar3;
  byte bVar4;
  ulong uVar5;
  sbyte sVar6;
  ulong uVar7;
  char *text;
  long lVar8;
  ulong *puVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  
  if ((ngx_cycle->log->log_level & 0x20) != 0) {
    ngx_log_error_core(8,ngx_cycle->log,0,"slab free: %p",p);
  }
  if ((p < pool->start) || (pool->end < p)) {
    text = "ngx_slab_free(): outside of pool";
    goto LAB_0011db7b;
  }
  lVar8 = (long)p - (long)pool->start >> ((byte)ngx_pagesize_shift & 0x3f);
  pnVar3 = pool->pages;
  page = pnVar3 + lVar8;
  uVar13 = pnVar3[lVar8].slab;
  switch((uint)pnVar3[lVar8].prev & 3) {
  case 0:
    if ((ngx_pagesize - 1 & (ulong)p) == 0) {
      if ((long)uVar13 < 0) {
        if (uVar13 != 0xffffffffffffffff) {
          ngx_slab_free_pages(pool,page,uVar13 & 0x7fffffffffffffff);
          return;
        }
        text = "ngx_slab_free(): pointer to wrong page";
      }
      else {
        text = "ngx_slab_free(): page is already free";
      }
      goto LAB_0011db7b;
    }
    break;
  case 1:
    uVar12 = (uint)uVar13 & 0xf;
    sVar6 = (sbyte)uVar12;
    if ((~(-1 << sVar6) & (uint)p) == 0) {
      bVar4 = (char)((ngx_pagesize - 1 & (ulong)p) >> sVar6) + 0x20;
      if ((uVar13 >> ((ulong)bVar4 & 0x3f) & 1) != 0) {
        lVar8 = (ulong)uVar12 - pool->min_shift;
        if (page->next == (ngx_slab_page_t *)0x0) {
          page->next = *(ngx_slab_page_t **)((long)pool + lVar8 * 0x18 + 0x98);
          *(ngx_slab_page_t **)((long)pool + lVar8 * 0x18 + 0x98) = page;
          page->prev = (long)pool + lVar8 * 0x18 + 0x90 | 1;
          page->next->prev = (ulong)page | 1;
        }
        uVar13 = uVar13 & ~(1L << (bVar4 & 0x3f));
        page->slab = uVar13;
        if (uVar13 >> 0x20 == 0) {
          ngx_slab_free_pages(pool,page,1);
          pool->stats[lVar8].total = pool->stats[lVar8].total - (ngx_pagesize >> sVar6);
        }
LAB_0011deb0:
        pnVar2 = &pool->stats[lVar8].used;
        *pnVar2 = *pnVar2 - 1;
        return;
      }
LAB_0011de50:
      text = "ngx_slab_free(): chunk is already free";
      goto LAB_0011db7b;
    }
    break;
  case 2:
    uVar10 = 1L << ((byte)((ngx_pagesize - 1 & (ulong)p) >> ((byte)ngx_slab_exact_shift & 0x3f)) &
                   0x3f);
    if ((ngx_slab_exact_size - 1 & (ulong)p) == 0) {
      if ((uVar10 & uVar13) != 0) {
        lVar8 = ngx_slab_exact_shift - pool->min_shift;
        if (uVar13 == 0xffffffffffffffff) {
          page->next = *(ngx_slab_page_t **)((long)pool + lVar8 * 0x18 + 0x98);
          *(ngx_slab_page_t **)((long)pool + lVar8 * 0x18 + 0x98) = page;
          page->prev = (long)pool + lVar8 * 0x18 + 0x90 | 2;
          page->next->prev = (ulong)page | 2;
        }
        uVar13 = uVar13 & ~uVar10;
        page->slab = uVar13;
        if (uVar13 == 0) {
          ngx_slab_free_pages(pool,page,1);
          pool->stats[lVar8].total = pool->stats[lVar8].total - 0x40;
        }
        goto LAB_0011deb0;
      }
      goto LAB_0011de50;
    }
    break;
  case 3:
    uVar12 = (uint)uVar13 & 0xf;
    sVar6 = (sbyte)uVar12;
    if ((~(-1 << sVar6) & (uint)p) == 0) {
      uVar5 = (ngx_pagesize - 1 & (ulong)p) >> sVar6;
      uVar13 = 1;
      uVar7 = uVar5 >> 6;
      puVar9 = (ulong *)(-ngx_pagesize & (ulong)p);
      uVar10 = puVar9[uVar7];
      if ((uVar10 >> (uVar5 & 0x3f) & 1) != 0) {
        lVar8 = (ulong)uVar12 - pool->min_shift;
        if (page->next == (ngx_slab_page_t *)0x0) {
          page->next = *(ngx_slab_page_t **)((long)pool + lVar8 * 0x18 + 0x98);
          *(ngx_slab_page_t **)((long)pool + lVar8 * 0x18 + 0x98) = page;
          page->prev = (long)pool + lVar8 * 0x18 + 0x90 | 3;
          page->next->prev = (ulong)page | 3;
          uVar10 = puVar9[uVar7];
        }
        puVar9[uVar7] = ~(1L << ((byte)uVar5 & 0x3f)) & uVar10;
        uVar10 = (ngx_pagesize >> sVar6) >> sVar6 + 3;
        lVar11 = uVar10 + (uVar10 == 0);
        if (*puVar9 >> ((byte)lVar11 & 0x3f) == 0) {
          do {
            if ((ngx_pagesize >> sVar6) >> 6 <= uVar13) {
              ngx_slab_free_pages(pool,page,1);
              pool->stats[lVar8].total =
                   pool->stats[lVar8].total + (lVar11 - (ngx_pagesize >> sVar6));
              break;
            }
            puVar1 = puVar9 + uVar13;
            uVar13 = uVar13 + 1;
          } while (*puVar1 == 0);
        }
        goto LAB_0011deb0;
      }
      goto LAB_0011de50;
    }
  }
  text = "ngx_slab_free(): pointer to wrong chunk";
LAB_0011db7b:
  ngx_slab_error(pool,2,text);
  return;
}

Assistant:

void
ngx_slab_free_locked(ngx_slab_pool_t *pool, void *p)
{
    size_t            size;
    uintptr_t         slab, m, *bitmap;
    ngx_uint_t        i, n, type, slot, shift, map;
    ngx_slab_page_t  *slots, *page;

    ngx_log_debug1(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0, "slab free: %p", p);

    if ((u_char *) p < pool->start || (u_char *) p > pool->end) {
        ngx_slab_error(pool, NGX_LOG_ALERT, "ngx_slab_free(): outside of pool");
        goto fail;
    }

    n = ((u_char *) p - pool->start) >> ngx_pagesize_shift;
    page = &pool->pages[n];
    slab = page->slab;
    type = ngx_slab_page_type(page);

    switch (type) {

    case NGX_SLAB_SMALL:

        shift = slab & NGX_SLAB_SHIFT_MASK;
        size = (size_t) 1 << shift;

        if ((uintptr_t) p & (size - 1)) {
            goto wrong_chunk;
        }

        n = ((uintptr_t) p & (ngx_pagesize - 1)) >> shift;
        m = (uintptr_t) 1 << (n % (sizeof(uintptr_t) * 8));
        n /= sizeof(uintptr_t) * 8;
        bitmap = (uintptr_t *)
                             ((uintptr_t) p & ~((uintptr_t) ngx_pagesize - 1));

        if (bitmap[n] & m) {
            slot = shift - pool->min_shift;

            if (page->next == NULL) {
                slots = ngx_slab_slots(pool);

                page->next = slots[slot].next;
                slots[slot].next = page;

                page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_SMALL;
                page->next->prev = (uintptr_t) page | NGX_SLAB_SMALL;
            }

            bitmap[n] &= ~m;

            n = (ngx_pagesize >> shift) / ((1 << shift) * 8);

            if (n == 0) {
                n = 1;
            }

            if (bitmap[0] & ~(((uintptr_t) 1 << n) - 1)) {
                goto done;
            }

            map = (ngx_pagesize >> shift) / (sizeof(uintptr_t) * 8);

            for (i = 1; i < map; i++) {
                if (bitmap[i]) {
                    goto done;
                }
            }

            ngx_slab_free_pages(pool, page, 1);

            pool->stats[slot].total -= (ngx_pagesize >> shift) - n;

            goto done;
        }

        goto chunk_already_free;

    case NGX_SLAB_EXACT:

        m = (uintptr_t) 1 <<
                (((uintptr_t) p & (ngx_pagesize - 1)) >> ngx_slab_exact_shift);
        size = ngx_slab_exact_size;

        if ((uintptr_t) p & (size - 1)) {
            goto wrong_chunk;
        }

        if (slab & m) {
            slot = ngx_slab_exact_shift - pool->min_shift;

            if (slab == NGX_SLAB_BUSY) {
                slots = ngx_slab_slots(pool);

                page->next = slots[slot].next;
                slots[slot].next = page;

                page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_EXACT;
                page->next->prev = (uintptr_t) page | NGX_SLAB_EXACT;
            }

            page->slab &= ~m;

            if (page->slab) {
                goto done;
            }

            ngx_slab_free_pages(pool, page, 1);

            pool->stats[slot].total -= sizeof(uintptr_t) * 8;

            goto done;
        }

        goto chunk_already_free;

    case NGX_SLAB_BIG:

        shift = slab & NGX_SLAB_SHIFT_MASK;
        size = (size_t) 1 << shift;

        if ((uintptr_t) p & (size - 1)) {
            goto wrong_chunk;
        }

        m = (uintptr_t) 1 << ((((uintptr_t) p & (ngx_pagesize - 1)) >> shift)
                              + NGX_SLAB_MAP_SHIFT);

        if (slab & m) {
            slot = shift - pool->min_shift;

            if (page->next == NULL) {
                slots = ngx_slab_slots(pool);

                page->next = slots[slot].next;
                slots[slot].next = page;

                page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_BIG;
                page->next->prev = (uintptr_t) page | NGX_SLAB_BIG;
            }

            page->slab &= ~m;

            if (page->slab & NGX_SLAB_MAP_MASK) {
                goto done;
            }

            ngx_slab_free_pages(pool, page, 1);

            pool->stats[slot].total -= ngx_pagesize >> shift;

            goto done;
        }

        goto chunk_already_free;

    case NGX_SLAB_PAGE:

        if ((uintptr_t) p & (ngx_pagesize - 1)) {
            goto wrong_chunk;
        }

        if (!(slab & NGX_SLAB_PAGE_START)) {
            ngx_slab_error(pool, NGX_LOG_ALERT,
                           "ngx_slab_free(): page is already free");
            goto fail;
        }

        if (slab == NGX_SLAB_PAGE_BUSY) {
            ngx_slab_error(pool, NGX_LOG_ALERT,
                           "ngx_slab_free(): pointer to wrong page");
            goto fail;
        }

        n = ((u_char *) p - pool->start) >> ngx_pagesize_shift;
        size = slab & ~NGX_SLAB_PAGE_START;

        ngx_slab_free_pages(pool, &pool->pages[n], size);

        ngx_slab_junk(p, size << ngx_pagesize_shift);

        return;
    }

    /* not reached */

    return;

done:

    pool->stats[slot].used--;

    ngx_slab_junk(p, size);

    return;

wrong_chunk:

    ngx_slab_error(pool, NGX_LOG_ALERT,
                   "ngx_slab_free(): pointer to wrong chunk");

    goto fail;

chunk_already_free:

    ngx_slab_error(pool, NGX_LOG_ALERT,
                   "ngx_slab_free(): chunk is already free");

fail:

    return;
}